

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

bool __thiscall spvtools::opt::LoopDescriptor::CreatePreHeaderBlocksIfMissing(LoopDescriptor *this)

{
  bool bVar1;
  iterator __begin2;
  iterator __end2;
  undefined1 local_d0 [8];
  _Map_pointer local_c8;
  size_t sStack_c0;
  _Elt_pointer local_b8;
  _Elt_pointer ppStack_b0;
  _Elt_pointer local_a8;
  _Map_pointer pppStack_a0;
  _Elt_pointer local_98;
  _Elt_pointer ppStack_90;
  _Elt_pointer local_88;
  _Map_pointer pppStack_80;
  undefined1 local_78 [16];
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  local_c8 = (_Map_pointer)0x0;
  sStack_c0 = 0;
  local_b8 = (_Elt_pointer)0x0;
  ppStack_b0 = (_Elt_pointer)0x0;
  local_a8 = (_Elt_pointer)0x0;
  pppStack_a0 = (_Map_pointer)0x0;
  local_98 = (_Elt_pointer)0x0;
  ppStack_90 = (_Elt_pointer)0x0;
  local_88 = (_Elt_pointer)0x0;
  pppStack_80 = (_Map_pointer)0x0;
  local_d0 = (undefined1  [8])&this->placeholder_top_loop_;
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                       *)&local_c8,0);
  if ((local_d0 != (undefined1  [8])0x0) &&
     (local_78._8_8_ =
           (((ChildrenList *)((long)local_d0 + 0x38))->
           super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>).
           _M_impl.super__Vector_impl_data._M_start,
     (pointer)local_78._8_8_ !=
     (((ChildrenList *)((long)local_d0 + 0x38))->
     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>)._M_impl.
     super__Vector_impl_data._M_finish)) {
    do {
      local_78._8_8_ = local_78._8_8_ + 8;
      local_78._0_8_ = local_d0;
      std::
      deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
      ::
      emplace_back<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>
                ((deque<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>,std::allocator<std::pair<spvtools::opt::Loop*,__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>>>>
                  *)&local_c8,
                 (pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
                  *)local_78);
      local_d0 = (undefined1  [8])
                 *(((ChildrenList *)((long)local_d0 + 0x38))->
                  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
      local_78._8_8_ =
           (((Loop *)local_d0)->nested_loops_).
           super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl
           .super__Vector_impl_data._M_start;
    } while ((pointer)local_78._8_8_ !=
             (((Loop *)local_d0)->nested_loops_).
             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_78._8_8_ = (Loop **)0x0;
  uStack_68 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uStack_38 = 0;
  local_30 = 0;
  uStack_28 = 0;
  bVar1 = false;
  local_78._0_8_ = &this->placeholder_top_loop_;
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                       *)(local_78 + 8),0);
  if (local_d0 != (undefined1  [8])local_78._0_8_) {
    bVar1 = false;
    do {
      if (*(BasicBlock **)((long)local_d0 + 0x20) == (BasicBlock *)0x0) {
        Loop::GetOrCreatePreHeaderBlock((Loop *)local_d0);
        bVar1 = true;
      }
      PostOrderTreeDFIterator<spvtools::opt::Loop>::operator++
                ((PostOrderTreeDFIterator<spvtools::opt::Loop> *)local_d0);
    } while (local_d0 != (undefined1  [8])local_78._0_8_);
  }
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                  *)(local_78 + 8));
  std::
  _Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,___gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>_>_>
                  *)&local_c8);
  return bVar1;
}

Assistant:

bool LoopDescriptor::CreatePreHeaderBlocksIfMissing() {
  auto modified = false;

  for (auto& loop : *this) {
    if (!loop.GetPreHeaderBlock()) {
      modified = true;
      // TODO(1841): Handle failure to create pre-header.
      loop.GetOrCreatePreHeaderBlock();
    }
  }

  return modified;
}